

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *window;
  int i;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  ImGuiWindow *root_window;
  ImGuiContext *g;
  ImGuiWindow *in_stack_ffffffffffffffb0;
  ImGuiWindow *this;
  int local_30;
  ImVec2 ref_window;
  ImRect in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
        pIVar3 = (ImGuiWindow *)0x0;
      }
      else {
        pIVar3 = GImGui->HoveredWindow->RootWindowDockStop;
      }
      if (pIVar3 == (ImGuiWindow *)0x0) {
        if ((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
           (pIVar3 = GetTopMostPopupModal(), pIVar3 == (ImGuiWindow *)0x0)) {
          FocusWindow(in_stack_ffffffffffffffb0);
        }
      }
      else {
        this = pIVar3;
        StartMouseMovingWindow(pIVar3);
        if ((((pIVar1->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
           (((pIVar3->Flags & 1U) == 0 || ((pIVar3->field_0x43a & 1) != 0)))) {
          in_stack_ffffffffffffffe0 = ImGuiWindow::TitleBarRect(this);
          bVar2 = ImRect::Contains((ImRect *)&stack0xffffffffffffffe0,(pIVar1->IO).MouseClickedPos);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pIVar1->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if (((pIVar1->IO).MouseClicked[1] & 1U) != 0) {
      pIVar3 = GetTopMostPopupModal();
      bVar2 = pIVar3 == (ImGuiWindow *)0x0;
      local_30 = (pIVar1->Windows).Size;
      while( true ) {
        local_30 = local_30 + -1;
        ref_window = in_stack_ffffffffffffffe0.Min;
        if (local_30 < 0 || bVar2) break;
        ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_30);
        ref_window = in_stack_ffffffffffffffe0.Min;
        if (*ppIVar4 == pIVar3) break;
        if (*ppIVar4 == pIVar1->HoveredWindow) {
          bVar2 = true;
        }
      }
      ClosePopupsOverWindow((ImGuiWindow *)ref_window,SUB81((ulong)pIVar3 >> 0x38,0));
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on void to focus window and start moving
    // (after we're done with all our widgets, so e.g. clicking on docking tab-bar which have set HoveredId already and not get us here!)
    if (g.IO.MouseClicked[0])
    {
        ImGuiWindow* root_window = g.HoveredWindow ? g.HoveredWindow->RootWindowDockStop : NULL;
        if (root_window != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly)
                if (!(root_window->Flags & ImGuiWindowFlags_NoTitleBar) || root_window->DockIsActive)
                    if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                        g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}